

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
expect<soul::TokenType>
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,TokenType expected)

{
  bool bVar1;
  TokenType *in_stack_ffffffffffffffa8;
  TokenType local_50;
  CompileMessage local_48;
  
  local_50.text = expected.text;
  bVar1 = matchIf<soul::TokenType>(this,expected);
  if (!bVar1) {
    CompileMessageHelpers::createMessage<soul::TokenType&,soul::TokenType&>
              (&local_48,(CompileMessageHelpers *)0x1,none,0x289dfe,(char *)&this->currentType,
               &local_50,in_stack_ffffffffffffffa8);
    (*this->_vptr_Tokeniser[2])(this,&local_48);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.description._M_dataplus._M_p != &local_48.description.field_2) {
      operator_delete(local_48.description._M_dataplus._M_p,
                      local_48.description.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void expect (Type expected)
    {
        if (! matchIf (expected))
            throwError (Errors::foundWhenExpecting (currentType, expected));
    }